

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1_util.cpp
# Opt level: O3

Pubkey * cfd::core::ConvertSecpPubkey
                   (Pubkey *__return_storage_ptr__,secp256k1_pubkey_conflict *pubkey)

{
  int iVar1;
  value_type_conflict *__val;
  secp256k1_context_struct *ctx;
  CfdException *this;
  size_t result_bytes_size;
  size_t local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  ByteData local_58;
  string local_40;
  
  ctx = wally_get_secp_context();
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x21);
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start + 0x21;
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0] = '\0';
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = '\0';
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = '\0';
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[3] = '\0';
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[4] = '\0';
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[5] = '\0';
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[6] = '\0';
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[7] = '\0';
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[8] = '\0';
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[9] = '\0';
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[10] = '\0';
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xb] = '\0';
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xc] = '\0';
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xd] = '\0';
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xe] = '\0';
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xf] = '\0';
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x10] = '\0';
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x11] = '\0';
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x12] = '\0';
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x13] = '\0';
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x14] = '\0';
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x15] = '\0';
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x16] = '\0';
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x17] = '\0';
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x18] = '\0';
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x19] = '\0';
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1a] = '\0';
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1b] = '\0';
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1c] = '\0';
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1d] = '\0';
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1e] = '\0';
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x1f] = '\0';
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0x20] = '\0';
  local_78 = 0x21;
  local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  iVar1 = secp256k1_ec_pubkey_serialize
                    (ctx,local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,&local_78,pubkey,0x102);
  if ((iVar1 == 1) && (local_78 == 0x21)) {
    ByteData::ByteData(&local_58,&local_70);
    Pubkey::Pubkey(__return_storage_ptr__,&local_58);
    if (local_58.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_70.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    return __return_storage_ptr__;
  }
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Secp256k1 serialize exception","");
  CfdException::CfdException(this,kCfdInternalError,&local_40);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Pubkey ConvertSecpPubkey(const secp256k1_pubkey& pubkey) {
  auto ctx = wally_get_secp_context();
  std::vector<uint8_t> result_bytes(Pubkey::kCompressedPubkeySize);
  size_t result_bytes_size = result_bytes.size();
  int ret = secp256k1_ec_pubkey_serialize(
      ctx, result_bytes.data(), &result_bytes_size, &pubkey,
      SECP256K1_EC_COMPRESSED);
  if (ret != 1 || (result_bytes_size != Pubkey::kCompressedPubkeySize)) {
    throw CfdException(
        CfdError::kCfdInternalError, "Secp256k1 serialize exception");
  }

  return Pubkey(result_bytes);
}